

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::MerkleBlock::Serialize(ByteData *__return_storage_ptr__,MerkleBlock *this)

{
  pointer pTVar1;
  const_reference cVar2;
  size_t p;
  ulong __n;
  Txid *txid;
  pointer this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  Serializer obj;
  ByteData bits;
  allocator_type local_89;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  Serializer local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  Serializer::Serializer(&local_70);
  Serializer::AddDirectNumber(&local_70,(uint32_t)this->transaction_count);
  Serializer::AddVariableInt
            (&local_70,
             (long)(this->txids_).
                   super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->txids_).
                   super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5);
  pTVar1 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->txids_).
                 super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1) {
    Txid::GetData((ByteData *)&local_88,this_00);
    Serializer::AddDirectBytes(&local_70,(ByteData *)&local_88);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
             (long)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p +
             (((ulong)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 7 >> 3
              ) - (long)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) &
             0x1fffffffffffffff,&local_89);
  for (__n = 0; __n < (ulong)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)(this->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      __n = __n + 1) {
    cVar2 = ::std::vector<bool,_std::allocator<bool>_>::operator[](&this->bits_,__n);
    local_88._M_impl.super__Vector_impl_data._M_start[__n >> 3] =
         local_88._M_impl.super__Vector_impl_data._M_start[__n >> 3] | cVar2 << ((byte)__n & 7);
  }
  ByteData::ByteData((ByteData *)&local_48,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  Serializer::AddVariableBuffer(&local_70,(ByteData *)&local_48);
  Serializer::Output(__return_storage_ptr__,&local_70);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  Serializer::~Serializer(&local_70);
  return __return_storage_ptr__;
}

Assistant:

ByteData MerkleBlock::Serialize() const {
  Serializer obj;
  obj.AddDirectNumber(static_cast<uint32_t>(transaction_count));
  obj.AddVariableInt(txids_.size());
  for (const auto& txid : txids_) {
    obj.AddDirectBytes(txid.GetData());
  }
  auto bits = BitsToBytes(bits_);
  obj.AddVariableBuffer(bits);
  return obj.Output();
}